

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.cpp
# Opt level: O1

Side banksia::string2Side(string *s)

{
  undefined **ppuVar1;
  int iVar2;
  long lVar3;
  
  toLower(s);
  if (sideStrings != (undefined *)0x0) {
    lVar3 = 0;
    do {
      iVar2 = std::__cxx11::string::compare((char *)s);
      if ((iVar2 == 0) || (iVar2 = std::__cxx11::string::compare((char *)s), iVar2 == 0)) {
        return (Side)lVar3;
      }
      ppuVar1 = &PTR_anon_var_dwarf_2c3ff3_001c53f8 + lVar3;
      lVar3 = lVar3 + 1;
    } while (*ppuVar1 != (undefined *)0x0);
  }
  return none;
}

Assistant:

Side string2Side(std::string s)
    {
        toLower(s);
        for(int i = 0; sideStrings[i]; i++) {
            if (sideStrings[i] == s || shortSideStrings[i] == s) {
                return static_cast<Side>(i);
            }
        }
        return Side::none;

    }